

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O1

void duckdb::MatchAndReplace<duckdb::StrpTimeFormat>
               (CSVOption<duckdb::StrpTimeFormat> *original,
               CSVOption<duckdb::StrpTimeFormat> *sniffed,string *name,string *error)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  ulong *local_128;
  long local_120;
  ulong local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  char local_90 [16];
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68 [24];
  idx_t local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if (original->set_by_user != true) {
    local_a8 = (undefined1  [8])&PTR__StrTimeFormat_0247ffd0;
    local_a0._M_p = local_90;
    pcVar3 = (sniffed->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar3,
               pcVar3 + (sniffed->value).super_StrTimeFormat.format_specifier._M_string_length);
    ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
              (&local_80,
               &(sniffed->value).super_StrTimeFormat.specifiers.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_68,&(sniffed->value).super_StrTimeFormat.literals.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    local_50 = (sniffed->value).super_StrTimeFormat.constant_size;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_48,
               &(sniffed->value).super_StrTimeFormat.numeric_width.
                super_vector<int,_std::allocator<int>_>);
    local_a8 = (undefined1  [8])&PTR__StrTimeFormat_02480048;
    CSVOption<duckdb::StrpTimeFormat>::Set(original,(StrpTimeFormat *)local_a8,false);
    StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_a8);
    return;
  }
  bVar4 = StrpTimeFormat::operator!=(&original->value,&sniffed->value);
  if (!bVar4) {
    return;
  }
  ::std::operator+(&local_148,
                   "CSV Sniffer: Sniffer detected value different than the user input for the ",name
                  );
  ::std::__cxx11::string::_M_append((char *)error,(ulong)local_148._M_dataplus._M_p);
  paVar2 = &local_148.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  pcVar3 = (original->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  local_c8[0] = local_b8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar3,
             pcVar3 + (original->value).super_StrTimeFormat.format_specifier._M_string_length);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_c8,0,(char *)0x0,0x1e2bbc0);
  local_e8 = &local_d8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_d8 = *plVar7;
    lStack_d0 = plVar5[3];
  }
  else {
    local_d8 = *plVar7;
    local_e8 = (long *)*plVar5;
  }
  local_e0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_e8);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_118 = *puVar8;
    uStack_110 = (undefined4)plVar5[3];
    uStack_10c = *(undefined4 *)((long)plVar5 + 0x1c);
    local_128 = &local_118;
  }
  else {
    local_118 = *puVar8;
    local_128 = (ulong *)*plVar5;
  }
  local_120 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar3 = (sniffed->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  local_108 = local_f8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,
             pcVar3 + (sniffed->value).super_StrTimeFormat.format_specifier._M_string_length);
  uVar10 = 0xf;
  if (local_128 != &local_118) {
    uVar10 = local_118;
  }
  if (uVar10 < (ulong)(local_100 + local_120)) {
    uVar10 = 0xf;
    if (local_108 != local_f8) {
      uVar10 = local_f8[0];
    }
    if ((ulong)(local_100 + local_120) <= uVar10) {
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_128);
      goto LAB_0152e824;
    }
  }
  puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_108);
LAB_0152e824:
  local_168 = &local_158;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_158 = *puVar1;
    uStack_150 = puVar6[3];
  }
  else {
    local_158 = *puVar1;
    local_168 = (undefined8 *)*puVar6;
  }
  local_160 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_168);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_148.field_2._M_allocated_capacity = *psVar9;
    local_148.field_2._8_8_ = plVar5[3];
    local_148._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar9;
    local_148._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_148._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)error,(ulong)local_148._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  return;
}

Assistant:

void MatchAndReplace(CSVOption<T> &original, CSVOption<T> &sniffed, const string &name, string &error) {
	if (original.IsSetByUser()) {
		// We verify that the user input matches the sniffed value
		if (original != sniffed) {
			error += "CSV Sniffer: Sniffer detected value different than the user input for the " + name;
			error += " options \n Set: " + original.FormatValue() + ", Sniffed: " + sniffed.FormatValue() + "\n";
		}
	} else {
		// We replace the value of original with the sniffed value
		original.Set(sniffed.GetValue(), false);
	}
}